

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t roaring_bitmap_serialize(roaring_bitmap_t *r,char *buf)

{
  size_t sVar1;
  uint64_t uVar2;
  uint64_t sizeasarray;
  uint64_t cardinality;
  size_t portablesize;
  char *buf_local;
  roaring_bitmap_t *r_local;
  
  sVar1 = roaring_bitmap_portable_size_in_bytes(r);
  uVar2 = roaring_bitmap_get_cardinality(r);
  if (sVar1 < uVar2 * 4 + 4) {
    *buf = '\x02';
    sVar1 = roaring_bitmap_portable_serialize(r,buf + 1);
    r_local = (roaring_bitmap_t *)(sVar1 + 1);
  }
  else {
    *buf = '\x01';
    sizeasarray._0_4_ = (undefined4)uVar2;
    *(undefined4 *)(buf + 1) = (undefined4)sizeasarray;
    roaring_bitmap_to_uint32_array(r,(uint32_t *)(buf + 5));
    r_local = (roaring_bitmap_t *)(uVar2 * 4 + 5);
  }
  return (size_t)r_local;
}

Assistant:

size_t roaring_bitmap_serialize(const roaring_bitmap_t *r, char *buf) {
    size_t portablesize = roaring_bitmap_portable_size_in_bytes(r);
    uint64_t cardinality = roaring_bitmap_get_cardinality(r);
    uint64_t sizeasarray = cardinality * sizeof(uint32_t) + sizeof(uint32_t);
    if (portablesize < sizeasarray) {
        buf[0] = SERIALIZATION_CONTAINER;
        return roaring_bitmap_portable_serialize(r, buf + 1) + 1;
    } else {
        buf[0] = SERIALIZATION_ARRAY_UINT32;
        memcpy(buf + 1, &cardinality, sizeof(uint32_t));
        roaring_bitmap_to_uint32_array(
            r, (uint32_t *)(buf + 1 + sizeof(uint32_t)));
        return 1 + (size_t)sizeasarray;
    }
}